

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

Option * docopt::Option::parse(Option *__return_storage_ptr__,string *option_description)

{
  undefined1 *puVar1;
  size_type *psVar2;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *this;
  long lVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  undefined8 *puVar10;
  long *plVar11;
  long lVar12;
  size_type *psVar13;
  long lVar14;
  string *this_00;
  char *pcVar15;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __b;
  undefined1 auStack_208 [8];
  smatch match;
  string local_1c0;
  string local_1a0;
  string *local_180;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  char *local_170;
  _Alloc_hider local_168;
  char local_160;
  undefined7 uStack_15f;
  match_flag_type mStack_158;
  undefined4 uStack_154;
  undefined1 local_150 [8];
  undefined1 local_148 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  string shortOption;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  string longOption;
  sregex_iterator i;
  string m;
  Kind local_78;
  value val;
  undefined1 local_40 [16];
  
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&shortOption._M_string_length;
  shortOption._M_dataplus._M_p = (pointer)0x0;
  shortOption._M_string_length._0_1_ = 0;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&longOption._M_string_length;
  longOption._M_dataplus._M_p = (pointer)0x0;
  longOption._M_string_length._0_1_ = 0;
  local_78 = Bool;
  val._0_8_ = val._0_8_ & 0xffffffffffffff00;
  sVar9 = std::__cxx11::string::find((char *)option_description,0x18006f,0);
  if (sVar9 == 0xffffffffffffffff) {
    sVar9 = option_description->_M_string_length;
  }
  __b._M_current = (option_description->_M_dataplus)._M_p + sVar9;
  if ((parse(std::__cxx11::string_const&)::pattern_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_),
     iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,"(-{1,2})?(.*?)([,= ]|$)",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_);
  }
  local_180 = option_description;
  local_178._M_current = __b._M_current;
  shortOption.field_2._8_8_ = __return_storage_ptr__;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)((long)&longOption.field_2 + 8),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(option_description->_M_dataplus)._M_p,__b,
                   &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,0x20);
  psVar2 = &m._M_string_length;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_208 = (undefined1  [8])0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.field_2._8_8_ = 0;
  this = (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          *)((long)&longOption.field_2 + 8);
  while (bVar7 = std::__cxx11::
                 regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                 ::operator==(this,(regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                    *)auStack_208), !bVar7) {
    lVar12 = (long)i._M_match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - i._24_8_;
    if (lVar12 == 0) {
      if (*(char *)(i._24_8_ + -0x38) != '\0') {
LAB_00168583:
        if (*(long *)(i._24_8_ + -0x40 + lVar12) - *(long *)(i._24_8_ + -0x48 + lVar12) != 1) {
LAB_001686ea:
          puVar10 = (undefined8 *)(i._24_8_ + lVar12 + -0x48);
          goto LAB_001686f1;
        }
LAB_00168597:
        puVar10 = (undefined8 *)(i._24_8_ + lVar12 + -0x48);
LAB_0016859e:
        if (*(char *)(puVar10 + 2) == '\x01') {
          val.variant._24_8_ = local_40;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)((long)&val.variant + 0x18),*puVar10,puVar10[1]);
        }
        else {
          val.variant._24_8_ = local_40;
          local_40[0] = 0;
        }
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)((long)&val.variant + 0x18),0,(char *)0x0,0x18203b);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar13) {
          m._M_string_length = *psVar13;
          m.field_2._M_allocated_capacity = plVar11[3];
          i._M_match._M_begin._M_current = (char *)psVar2;
        }
        else {
          m._M_string_length = *psVar13;
          i._M_match._M_begin._M_current = (char *)*plVar11;
        }
        m._M_dataplus._M_p = (pointer)plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        this_00 = (string *)&local_128;
LAB_00168796:
        std::__cxx11::string::operator=(this_00,(string *)&i._M_match._M_begin);
        if ((size_type *)i._M_match._M_begin._M_current != psVar2) {
          operator_delete(i._M_match._M_begin._M_current);
        }
        if (val.variant._24_8_ != local_40) {
          operator_delete((void *)val.variant._24_8_);
        }
      }
    }
    else {
      lVar14 = (lVar12 >> 3) * -0x5555555555555555;
      if (lVar14 - 5U < 0xfffffffffffffffe) {
        if (*(char *)(i._24_8_ + 0x28) != '\0') {
          if ((*(char *)(i._24_8_ + 0x28) == '\x01') &&
             (*(long *)(i._24_8_ + 0x20) - *(long *)(i._24_8_ + 0x18) == 1)) {
            if (0xfffffffffffffffc < lVar14 - 6U) goto LAB_00168597;
            puVar10 = (undefined8 *)(i._24_8_ + 0x30);
            goto LAB_0016859e;
          }
          if (0xfffffffffffffffc < lVar14 - 6U) goto LAB_001686ea;
          puVar10 = (undefined8 *)(i._24_8_ + 0x30);
LAB_001686f1:
          if (*(char *)(puVar10 + 2) == '\x01') {
            val.variant._24_8_ = local_40;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)((long)&val.variant + 0x18),*puVar10,puVar10[1]);
          }
          else {
            val.variant._24_8_ = local_40;
            local_40[0] = 0;
          }
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)((long)&val.variant + 0x18),0,(char *)0x0,0x18203a);
          psVar13 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar13) {
            m._M_string_length = *psVar13;
            m.field_2._M_allocated_capacity = plVar11[3];
            i._M_match._M_begin._M_current = (char *)psVar2;
          }
          else {
            m._M_string_length = *psVar13;
            i._M_match._M_begin._M_current = (char *)*plVar11;
          }
          m._M_dataplus._M_p = (pointer)plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          this_00 = (string *)&local_100;
          goto LAB_00168796;
        }
        if (0xfffffffffffffffc < lVar14 - 6U) goto LAB_001685f3;
        if ((*(char *)(i._24_8_ + 0x40) != '\x01') ||
           (*(long *)(i._24_8_ + 0x38) - *(long *)(i._24_8_ + 0x30) < 1)) goto LAB_001687c5;
        puVar10 = (undefined8 *)(i._24_8_ + 0x30);
      }
      else {
        if (*(char *)(i._24_8_ + -0x38 + lVar12) != '\0') {
          if (*(char *)(i._24_8_ + -0x38 + lVar12) == '\x01') goto LAB_00168583;
          goto LAB_001686ea;
        }
LAB_001685f3:
        if ((*(char *)(i._24_8_ + -0x38 + lVar12) != '\x01') ||
           (lVar14 = *(long *)(i._24_8_ + -0x40 + lVar12),
           lVar3 = *(long *)(i._24_8_ + -0x48 + lVar12), lVar14 == lVar3 || lVar14 - lVar3 < 0))
        goto LAB_001687c5;
        puVar10 = (undefined8 *)(i._24_8_ + lVar12 + -0x48);
      }
      if ((*(char *)(puVar10 + 2) == '\x01') &&
         (i._M_match._M_begin._M_current = (char *)psVar2,
         std::__cxx11::string::
         _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ((string *)&i._M_match._M_begin,*puVar10,puVar10[1]),
         (size_type *)i._M_match._M_begin._M_current != psVar2)) {
        operator_delete(i._M_match._M_begin._M_current);
      }
      m.field_2._8_8_ = 1;
    }
LAB_001687c5:
    lVar12 = (long)i._M_match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - i._24_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffb < (lVar12 >> 3) * -0x5555555555555555 - 7U)) {
      plVar11 = (long *)(i._24_8_ + lVar12 + -0x48);
    }
    else {
      plVar11 = (long *)(i._24_8_ + 0x48);
    }
    if (((char)plVar11[2] != '\x01') || (plVar11[1] == *plVar11)) break;
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(this);
  }
  if (match._M_begin._M_current != (char *)0x0) {
    operator_delete(match._M_begin._M_current);
  }
  if (i._24_8_ != 0) {
    operator_delete((void *)i._24_8_);
  }
  if (m.field_2._8_4_ == 0) goto LAB_00168aab;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_208 = (undefined1  [8])0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar4 = (local_180->_M_dataplus)._M_p;
  sVar9 = local_180->_M_string_length;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&longOption.field_2 + 8)
             ,"\\[default: (.*)\\]",1);
  bVar7 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_178,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(pcVar4 + sVar9),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)auStack_208,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     ((long)&longOption.field_2 + 8),0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&longOption.field_2 + 8)
            );
  if (bVar7) {
    lVar12 = (long)match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_208;
    if ((lVar12 == 0) || (0xfffffffffffffffd < (lVar12 >> 3) * -0x5555555555555555 - 5U)) {
      pcVar15 = (char *)((long)auStack_208 + lVar12 + -0x48);
    }
    else {
      pcVar15 = (char *)((long)auStack_208 + 0x18);
    }
    if (pcVar15[0x10] == '\x01') {
      local_170 = &local_160;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_170,*(undefined8 *)pcVar15,*(undefined8 *)(pcVar15 + 8));
      if (local_170 == &local_160) goto LAB_00168973;
      i._M_begin._M_current = local_170;
      i._M_pregex = (regex_type *)CONCAT71(uStack_15f,local_160);
    }
    else {
      local_168._M_p = (char *)0x0;
      local_160 = '\0';
LAB_00168973:
      i._M_begin._M_current = (char *)&i._M_pregex;
      i._M_pregex = (regex_type *)CONCAT71(uStack_15f,local_160);
      i._M_flags = mStack_158;
      i._28_4_ = uStack_154;
    }
    _Var5._M_p = local_168._M_p;
    i._M_end._M_current = local_168._M_p;
    longOption.field_2._8_4_ = 3;
    local_160 = '\0';
    local_168._M_p = (char *)0x0;
    local_78 = String;
    local_170 = &local_160;
    switch(0x1689fe) {
    case 0:
      val.kind._0_1_ = i._M_begin._M_current._0_1_;
      break;
    case 1:
      val._0_8_ = i._M_begin._M_current;
      break;
    case 2:
      val._0_8_ = (long)&val.variant + 8;
      if ((regex_type **)i._M_begin._M_current == &i._M_pregex) {
        val.variant.strList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)i._24_8_;
      }
      else {
        val._0_8_ = i._M_begin._M_current;
      }
      val.variant.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)i._M_pregex;
      val.variant.strValue._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)_Var5._M_p;
      i._M_end._M_current = (char *)0x0;
      i._M_pregex = (regex_type *)((ulong)i._M_pregex & 0xffffffffffffff00);
      i._M_begin._M_current = (char *)&i._M_pregex;
      break;
    case 3:
      val._0_8_ = i._M_begin._M_current;
      val.variant.strValue._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)_Var5._M_p;
      val.variant.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)i._M_pregex;
      i._M_begin._M_current = (char *)0x0;
      i._M_end._M_current = (char *)0x0;
      i._M_pregex = (regex_type *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
  }
  if (auStack_208 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_208);
  }
LAB_00168aab:
  uVar6 = shortOption.field_2._8_8_;
  psVar2 = &shortOption._M_string_length;
  if (local_128 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_1c0.field_2._8_8_ = shortOption.field_2._M_allocated_capacity;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  }
  else {
    local_1c0._M_dataplus._M_p = (pointer)local_128;
  }
  local_1c0.field_2._M_allocated_capacity._1_7_ = shortOption._M_string_length._1_7_;
  local_1c0.field_2._M_local_buf[0] = (undefined1)shortOption._M_string_length;
  psVar13 = &longOption._M_string_length;
  local_1c0._M_string_length = (size_type)shortOption._M_dataplus._M_p;
  shortOption._M_dataplus._M_p = (pointer)0x0;
  shortOption._M_string_length._0_1_ = 0;
  if (local_100 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1a0.field_2._8_8_ = longOption.field_2._M_allocated_capacity;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  }
  else {
    local_1a0._M_dataplus._M_p = (pointer)local_100;
  }
  local_1a0.field_2._M_allocated_capacity._1_7_ = longOption._M_string_length._1_7_;
  local_1a0.field_2._M_local_buf[0] = (undefined1)longOption._M_string_length;
  local_1a0._M_string_length = (size_type)longOption._M_dataplus._M_p;
  longOption._M_dataplus._M_p = (pointer)0x0;
  longOption._M_string_length._0_1_ = 0;
  local_150._0_4_ = local_78;
  switch(local_78) {
  case Bool:
    local_148[0] = (undefined1)val.kind;
    break;
  case Long:
    local_148._0_8_ = val._0_8_;
    break;
  case String:
    local_148._0_8_ = local_148 + 0x10;
    puVar1 = (undefined1 *)((long)&val.variant + 8);
    if ((undefined1 *)val._0_8_ == puVar1) {
      local_148._24_8_ =
           val.variant.strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_148._0_8_ = val._0_8_;
    }
    local_148._16_8_ = val.variant.strValue._M_string_length;
    local_148._8_8_ = val.variant.longValue;
    val.variant.longValue = 0;
    val.variant.strValue._M_string_length =
         val.variant.strValue._M_string_length & 0xffffffffffffff00;
    val._0_8_ = puVar1;
    break;
  case StringList:
    local_148._0_8_ = val._0_8_;
    local_148._8_8_ = val.variant.longValue;
    local_148._16_8_ = val.variant.strValue._M_string_length;
    val.kind = Empty;
    val._4_4_ = 0;
    val.variant.longValue = 0;
    val.variant.strValue._M_string_length = 0;
  }
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar2;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13;
  Option((Option *)shortOption.field_2._8_8_,&local_1c0,&local_1a0,(int)m.field_2._8_8_,
         (value *)local_150);
  if (local_150._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  }
  else if ((local_150._0_4_ == String) && ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)))
  {
    operator_delete((void *)local_148._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (local_78 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&val);
  }
  else if ((local_78 == String) &&
          ((undefined1 *)val._0_8_ != (undefined1 *)((long)&val.variant + 8))) {
    operator_delete((void *)val._0_8_);
  }
  if (local_100 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    operator_delete(local_100);
  }
  if (local_128 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    operator_delete(local_128);
  }
  return (Option *)uVar6;
}

Assistant:

inline Option Option::parse(std::string const& option_description)
	{
		std::string shortOption, longOption;
		int argcount = 0;
		value val { false };

		auto double_space = option_description.find("  ");
		auto options_end = option_description.end();
		if (double_space != std::string::npos) {
			options_end = option_description.begin() + static_cast<std::ptrdiff_t>(double_space);
		}

		static const std::regex pattern {"(-{1,2})?(.*?)([,= ]|$)"};
		for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
			   e{};
			i != e;
			++i)
		{
			std::smatch const& match = *i;
			if (match[1].matched) { // [1] is optional.
				if (match[1].length()==1) {
						shortOption = "-" + match[2].str();
				} else {
						longOption =  "--" + match[2].str();
				}
			} else if (match[2].length() > 0) { // [2] always matches.
				std::string m = match[2];
				argcount = 1;
			} else {
				// delimeter
			}

			if (match[3].length() == 0) { // [3] always matches.
				// Hit end of string. For some reason 'match_not_null' will let us match empty
				// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
				// match, we know we must be at the end.
				break;
			}
		}

		if (argcount) {
			std::smatch match;
			if (std::regex_search(options_end, option_description.end(),
						  match,
						  std::regex{"\\[default: (.*)\\]", std::regex::icase}))
			{
				val = match[1].str();
			}
		}

		return {std::move(shortOption),
			std::move(longOption),
			argcount,
			std::move(val)};
	}